

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketIO.cpp
# Opt level: O1

void __thiscall PacketIO::Start(PacketIO *this,RxDataHandler rxData)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint8_t *__buf;
  ssize_t sVar4;
  packet_mreq mreq;
  ifreq ifr;
  int local_50 [4];
  char local_40 [16];
  int local_30;
  
  iVar1 = socket(0x11,3,0x300);
  this->m_RawSocket = iVar1;
  if (iVar1 != -1) {
    GetInterface(local_40);
    printf("Using interface \'%s\'\n",local_40);
    iVar1 = ioctl(this->m_RawSocket,0x8933,local_40);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      printf("oh crap %s\n",pcVar3);
    }
    this->m_IfIndex = local_30;
    local_50[0] = local_30;
    local_50[1] = 0x60001;
    iVar1 = setsockopt(this->m_RawSocket,0x107,1,local_50,0x10);
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      printf("promiscuous membership error %s",pcVar3);
    }
    __buf = (uint8_t *)malloc(0x5ea);
    do {
      sVar4 = recvfrom(this->m_RawSocket,__buf,0x5ea,0,(sockaddr *)0x0,(socklen_t *)0x0);
      (*rxData)(__buf,(long)(int)sVar4);
    } while( true );
  }
  piVar2 = __errno_location();
  if (*piVar2 != 1) {
    puts("Error while creating socket. Aborting...");
    return;
  }
  puts("need root privileges, try \'sudo ./test_app\'");
  exit(-1);
}

Assistant:

void PacketIO::Start(RxDataHandler rxData)
{
    m_RawSocket = socket(AF_PACKET, SOCK_RAW, htons(ETH_P_ALL));
    if (m_RawSocket == -1)
    {
        if (errno == EPERM)
        {
            printf("need root privileges, try 'sudo ./test_app'\n");
            exit(-1);
        }
        else
        {
            printf("Error while creating socket. Aborting...\n");
        }
    }
    else
    {
        struct ifreq ifr;
        PacketIO::GetInterface(ifr.ifr_name);
        printf("Using interface '%s'\n", ifr.ifr_name);

        // Find the socket index for tx later
        if (ioctl(m_RawSocket, SIOCGIFINDEX, &ifr) == -1)
        {
            printf("oh crap %s\n", strerror(errno));
        }
        m_IfIndex = ifr.ifr_ifindex;

        // Set socket to promiscuous mode
        struct packet_mreq mreq;
        mreq.mr_ifindex = ifr.ifr_ifindex;
        mreq.mr_type = PACKET_MR_PROMISC;
        mreq.mr_alen = 6;
        if (setsockopt(
                m_RawSocket, SOL_PACKET, PACKET_ADD_MEMBERSHIP, &mreq, (socklen_t)sizeof(mreq)) < 0)
        {
            printf("promiscuous membership error %s", strerror(errno));
        }

        void* pkt_data = (void*)malloc(ETH_FRAME_LEN);
        while (1)
        {
            int length = recvfrom(m_RawSocket, pkt_data, ETH_FRAME_LEN, 0, nullptr, nullptr);
            rxData((uint8_t*)pkt_data, length);
        }
        free(pkt_data); // no way to get here, but ...
    }
}